

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O3

void cht_Give(player_t *player,char *name,int amount)

{
  APlayerPawn *this;
  PClassWeapon *type;
  BYTE *pBVar1;
  bool bVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined8 *puVar7;
  PClassInventory *pPVar8;
  AActor *pAVar9;
  AInventory *pAVar10;
  PClassWeapon *pPVar11;
  PClassActor *pPVar12;
  PClassInventory *pPVar13;
  PClassActor *pPVar14;
  AWeapon *pAVar15;
  ulong uVar16;
  bool bVar17;
  DVector3 local_58;
  AWeapon *local_38;
  
  if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
    puVar3 = (undefined8 *)
             ((long)&((player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1ea) * 0x18));
    do {
      puVar7 = puVar3;
      puVar3 = (undefined8 *)*puVar7;
    } while (*(int *)(puVar7 + 1) != 0x1ea);
    Printf("%s is a cheater: give %s\n",*(undefined8 *)(puVar7[2] + 0x28),name);
  }
  this = player->mo;
  if (this == (APlayerPawn *)0x0) {
    return;
  }
  if (player->health < 1) {
    return;
  }
  iVar5 = strcasecmp(name,"all");
  if (iVar5 == 0) {
    bVar2 = false;
    bVar17 = false;
  }
  else {
    iVar5 = strcasecmp(name,"everything");
    bVar17 = iVar5 == 0;
    bVar2 = !bVar17;
  }
  iVar5 = strcasecmp(name,"health");
  if (iVar5 == 0) {
    if (amount < 1) {
      iVar5 = APlayerPawn::GetMaxHealth(this);
      (player->mo->super_AActor).health = iVar5;
    }
    else {
      iVar5 = (this->super_AActor).health + amount;
      (this->super_AActor).health = iVar5;
    }
    player->health = iVar5;
  }
  if ((bVar2) && (iVar5 = strcasecmp(name,"backpack"), iVar5 != 0)) {
    iVar5 = strcasecmp(name,"ammo");
    if (iVar5 == 0) goto LAB_003a1bfa;
    iVar5 = strcasecmp(name,"armor");
    if (iVar5 == 0) goto LAB_003a1cb8;
    iVar5 = strcasecmp(name,"keys");
    if (iVar5 == 0) goto LAB_003a1dc3;
    iVar5 = strcasecmp(name,"weapons");
    uVar6 = PClassActor::AllActorClasses.Count;
    if (iVar5 == 0) goto LAB_003a1e8c;
    iVar5 = strcasecmp(name,"artifacts");
    uVar6 = PClassActor::AllActorClasses.Count;
    if (iVar5 != 0) {
      iVar5 = strcasecmp(name,"puzzlepieces");
      if (iVar5 != 0) {
        pPVar8 = (PClassInventory *)PClass::FindActor(name);
        if (pPVar8 == (PClassInventory *)0x0) {
LAB_003a21cd:
          if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
            return;
          }
          Printf("Unknown item \"%s\"\n",name);
          return;
        }
        pPVar13 = pPVar8;
        if (pPVar8 != (PClassInventory *)AInventory::RegistrationInfo.MyClass) {
          do {
            pPVar13 = (PClassInventory *)(pPVar13->super_PClassActor).super_PClass.ParentClass;
            if (pPVar13 == (PClassInventory *)AInventory::RegistrationInfo.MyClass) break;
          } while (pPVar13 != (PClassInventory *)0x0);
          if (pPVar13 == (PClassInventory *)0x0) goto LAB_003a21cd;
        }
        AActor::GiveInventory(&player->mo->super_AActor,pPVar8,amount,true);
        return;
      }
      if (PClassActor::AllActorClasses.Count == 0) {
        return;
      }
      goto LAB_003a212d;
    }
  }
  else {
    pPVar8 = (PClassInventory *)PClass::FindActor(&gameinfo.backpacktype);
    if (pPVar8 != (PClassInventory *)0x0) {
      AActor::GiveInventory(&player->mo->super_AActor,pPVar8,1,true);
    }
    if (bVar2) {
      return;
    }
LAB_003a1bfa:
    if (PClassActor::AllActorClasses.Count != 0) {
      uVar16 = 0;
      do {
        pPVar12 = PClassActor::AllActorClasses.Array[uVar16];
        if ((pPVar12->super_PClass).ParentClass == AAmmo::RegistrationInfo.MyClass) {
          pAVar10 = AActor::FindInventory(&player->mo->super_AActor,pPVar12,false);
          if (pAVar10 == (AInventory *)0x0) {
            local_58.X = 0.0;
            local_58.Y = 0.0;
            local_58.Z = 0.0;
            pAVar9 = AActor::StaticSpawn(pPVar12,&local_58,NO_REPLACE,false);
            (*(pAVar9->super_DThinker).super_DObject._vptr_DObject[0x29])(pAVar9,player->mo);
            *(undefined4 *)&pAVar9[1].super_DThinker.super_DObject.Class =
                 *(undefined4 *)((long)&pAVar9[1].super_DThinker.super_DObject.Class + 4);
          }
          else if (pAVar10->Amount < pAVar10->MaxAmount) {
            pAVar10->Amount = pAVar10->MaxAmount;
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < PClassActor::AllActorClasses.Count);
    }
    if (bVar2) {
      return;
    }
LAB_003a1cb8:
    if (gameinfo.gametype == GAME_Hexen) {
      iVar5 = 0;
      do {
        local_58.X = 0.0;
        local_58.Y = 0.0;
        local_58.Z = 0.0;
        pAVar10 = (AInventory *)
                  AActor::StaticSpawn((PClassActor *)AHexenArmor::RegistrationInfo.MyClass,&local_58
                                      ,NO_REPLACE,false);
        (pAVar10->super_AActor).health = iVar5;
        pAVar10->Amount = 0;
        bVar4 = AInventory::CallTryPickup(pAVar10,&player->mo->super_AActor,(AActor **)0x0);
        if (!bVar4) {
          (*(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar10);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != 4);
    }
    else {
      local_58.X = 0.0;
      local_58.Y = 0.0;
      local_58.Z = 0.0;
      pAVar10 = (AInventory *)
                AActor::StaticSpawn((PClassActor *)ABasicArmorPickup::RegistrationInfo.MyClass,
                                    &local_58,NO_REPLACE,false);
      *(int *)&pAVar10[1].super_AActor.super_DThinker.super_DObject.ObjNext = deh.BlueAC * 100;
      pAVar10[1].super_AActor.super_DThinker.super_DObject._vptr_DObject =
           (_func_int **)
           (~-(ulong)(0.0 < gameinfo.Armor2Percent) & 0x3fe0000000000000 |
           (ulong)gameinfo.Armor2Percent & -(ulong)(0.0 < gameinfo.Armor2Percent));
      bVar4 = AInventory::CallTryPickup(pAVar10,&player->mo->super_AActor,(AActor **)0x0);
      if (!bVar4) {
        (*(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar10);
      }
    }
    if (bVar2) {
      return;
    }
LAB_003a1dc3:
    if (PClassActor::AllActorClasses.Count == 0) {
      uVar6 = 0;
    }
    else {
      uVar16 = 0;
      do {
        pPVar12 = PClassActor::AllActorClasses.Array[uVar16];
        pPVar14 = pPVar12;
        if (pPVar12 == (PClassActor *)AKey::RegistrationInfo.MyClass) {
LAB_003a1e13:
          if ((pPVar12->super_PClass).Defaults[0x4fc] != '\0') {
            local_58.X = 0.0;
            local_58.Y = 0.0;
            local_58.Z = 0.0;
            pAVar10 = (AInventory *)AActor::StaticSpawn(pPVar12,&local_58,NO_REPLACE,false);
            bVar4 = AInventory::CallTryPickup(pAVar10,&player->mo->super_AActor,(AActor **)0x0);
            if (!bVar4) {
              (*(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar10);
            }
          }
        }
        else {
          do {
            pPVar14 = (PClassActor *)(pPVar14->super_PClass).ParentClass;
            if (pPVar14 == (PClassActor *)AKey::RegistrationInfo.MyClass) break;
          } while (pPVar14 != (PClassActor *)0x0);
          if (pPVar14 != (PClassActor *)0x0) goto LAB_003a1e13;
        }
        uVar16 = uVar16 + 1;
        uVar6 = PClassActor::AllActorClasses.Count;
      } while (uVar16 < PClassActor::AllActorClasses.Count);
    }
    if (bVar2) {
      return;
    }
LAB_003a1e8c:
    if (uVar6 == 0) {
      pAVar15 = player->PendingWeapon;
      uVar6 = 0;
    }
    else {
      uVar16 = 0;
      local_38 = player->PendingWeapon;
      do {
        type = (PClassWeapon *)PClassActor::AllActorClasses.Array[uVar16];
        pPVar11 = type;
        if (type != (PClassWeapon *)AWeapon::RegistrationInfo.MyClass) {
          do {
            pPVar11 = (PClassWeapon *)
                      (pPVar11->super_PClassInventory).super_PClassActor.super_PClass.ParentClass;
            if (pPVar11 == (PClassWeapon *)AWeapon::RegistrationInfo.MyClass) break;
          } while (pPVar11 != (PClassWeapon *)0x0);
          if (pPVar11 != (PClassWeapon *)0x0) {
            pPVar11 = (PClassWeapon *)PClassActor::GetReplacement((PClassActor *)type,true);
            if ((pPVar11 != type) &&
               (pPVar12 = PClassActor::GetReplacement((PClassActor *)type,true),
               pPVar12 != (PClassActor *)ADehackedPickup::RegistrationInfo.MyClass)) {
              do {
                pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
                if (pPVar12 == (PClassActor *)ADehackedPickup::RegistrationInfo.MyClass) break;
              } while (pPVar12 != (PClassActor *)0x0);
              if (pPVar12 == (PClassActor *)0x0) goto LAB_003a1f70;
            }
            bVar4 = FWeaponSlots::LocateWeapon(&player->weapons,type,(int *)0x0,(int *)0x0);
            if ((bVar4) &&
               ((bVar17 ||
                (((type->super_PClassInventory).super_PClassActor.super_PClass.Defaults[0x4ff] & 8)
                 == 0)))) {
              AActor::GiveInventory(&player->mo->super_AActor,(PClassInventory *)type,1,true);
            }
          }
        }
LAB_003a1f70:
        uVar16 = uVar16 + 1;
        pAVar15 = local_38;
        uVar6 = PClassActor::AllActorClasses.Count;
      } while (uVar16 < PClassActor::AllActorClasses.Count);
    }
    player->PendingWeapon = pAVar15;
    if (bVar2) {
      return;
    }
  }
  if (uVar6 == 0) {
    return;
  }
  uVar16 = 0;
  do {
    pPVar8 = (PClassInventory *)PClassActor::AllActorClasses.Array[uVar16];
    pPVar13 = pPVar8;
    if (pPVar8 == (PClassInventory *)AInventory::RegistrationInfo.MyClass) {
LAB_003a2009:
      pBVar1 = (pPVar8->super_PClassActor).super_PClass.Defaults;
      if (((0 < *(int *)(pBVar1 + 0x4d8)) && (1 < *(int *)(pBVar1 + 0x4cc))) &&
         (pPVar13 = pPVar8, pPVar8 != (PClassInventory *)APuzzleItem::RegistrationInfo.MyClass)) {
        do {
          pPVar13 = (PClassInventory *)(pPVar13->super_PClassActor).super_PClass.ParentClass;
          if (pPVar13 == (PClassInventory *)APuzzleItem::RegistrationInfo.MyClass) break;
        } while (pPVar13 != (PClassInventory *)0x0);
        if ((pPVar13 == (PClassInventory *)0x0) &&
           (pPVar13 = pPVar8, pPVar8 != (PClassInventory *)APowerup::RegistrationInfo.MyClass)) {
          do {
            pPVar13 = (PClassInventory *)(pPVar13->super_PClassActor).super_PClass.ParentClass;
            if (pPVar13 == (PClassInventory *)APowerup::RegistrationInfo.MyClass) break;
          } while (pPVar13 != (PClassInventory *)0x0);
          if ((pPVar13 == (PClassInventory *)0x0) &&
             (pPVar13 = pPVar8, pPVar8 != (PClassInventory *)AArmor::RegistrationInfo.MyClass)) {
            do {
              pPVar13 = (PClassInventory *)(pPVar13->super_PClassActor).super_PClass.ParentClass;
              if (pPVar13 == (PClassInventory *)AArmor::RegistrationInfo.MyClass) break;
            } while (pPVar13 != (PClassInventory *)0x0);
            if ((pPVar13 == (PClassInventory *)0x0) &&
               ((bVar17 ||
                (pPVar13 = (PClassInventory *)
                           PClassActor::GetReplacement((PClassActor *)pPVar8,true),
                pPVar13 == pPVar8)))) {
              iVar5 = amount;
              if (amount < 1) {
                iVar5 = *(int *)(pBVar1 + 0x4cc);
              }
              AActor::GiveInventory(&player->mo->super_AActor,pPVar8,iVar5,true);
            }
          }
        }
      }
    }
    else {
      do {
        pPVar13 = (PClassInventory *)(pPVar13->super_PClassActor).super_PClass.ParentClass;
        if (pPVar13 == (PClassInventory *)AInventory::RegistrationInfo.MyClass) break;
      } while (pPVar13 != (PClassInventory *)0x0);
      if (pPVar13 != (PClassInventory *)0x0) goto LAB_003a2009;
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 < PClassActor::AllActorClasses.Count);
  if (bVar2 || PClassActor::AllActorClasses.Count == 0) {
    return;
  }
LAB_003a212d:
  uVar16 = 0;
  do {
    pPVar8 = (PClassInventory *)PClassActor::AllActorClasses.Array[uVar16];
    pPVar13 = pPVar8;
    if (pPVar8 == (PClassInventory *)APuzzleItem::RegistrationInfo.MyClass) {
LAB_003a2168:
      pBVar1 = (pPVar8->super_PClassActor).super_PClass.Defaults;
      if ((0 < *(int *)(pBVar1 + 0x4d8)) &&
         ((bVar17 ||
          (pPVar13 = (PClassInventory *)PClassActor::GetReplacement((PClassActor *)pPVar8,true),
          pPVar13 == pPVar8)))) {
        iVar5 = amount;
        if (amount < 1) {
          iVar5 = *(int *)(pBVar1 + 0x4cc);
        }
        AActor::GiveInventory(&player->mo->super_AActor,pPVar8,iVar5,true);
      }
    }
    else {
      do {
        pPVar13 = (PClassInventory *)(pPVar13->super_PClassActor).super_PClass.ParentClass;
        if (pPVar13 == (PClassInventory *)APuzzleItem::RegistrationInfo.MyClass) break;
      } while (pPVar13 != (PClassInventory *)0x0);
      if (pPVar13 != (PClassInventory *)0x0) goto LAB_003a2168;
    }
    uVar16 = uVar16 + 1;
    if (PClassActor::AllActorClasses.Count <= uVar16) {
      return;
    }
  } while( true );
}

Assistant:

void cht_Give (player_t *player, const char *name, int amount)
{
	enum { ALL_NO, ALL_YES, ALL_YESYES } giveall;
	int i;
	PClassActor *type;

	if (player != &players[consoleplayer])
		Printf ("%s is a cheater: give %s\n", player->userinfo.GetName(), name);

	if (player->mo == NULL || player->health <= 0)
	{
		return;
	}

	giveall = ALL_NO;
	if (stricmp (name, "all") == 0)
	{
		giveall = ALL_YES;
	}
	else if (stricmp (name, "everything") == 0)
	{
		giveall = ALL_YESYES;
	}

	if (stricmp (name, "health") == 0)
	{
		if (amount > 0)
		{
			player->mo->health += amount;
			player->health = player->mo->health;
		}
		else
		{
			player->health = player->mo->health = player->mo->GetMaxHealth();
		}
	}

	if (giveall || stricmp (name, "backpack") == 0)
	{
		// Select the correct type of backpack based on the game
		type = PClass::FindActor(gameinfo.backpacktype);
		if (type != NULL)
		{
			player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "ammo") == 0)
	{
		// Find every unique type of ammo. Give it to the player if
		// he doesn't have it already, and set each to its maximum.
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClassActor *type = PClassActor::AllActorClasses[i];

			if (type->ParentClass == RUNTIME_CLASS(AAmmo))
			{
				PClassAmmo *atype = static_cast<PClassAmmo *>(type);
				AInventory *ammo = player->mo->FindInventory(atype);
				if (ammo == NULL)
				{
					ammo = static_cast<AInventory *>(Spawn (atype));
					ammo->AttachToOwner (player->mo);
					ammo->Amount = ammo->MaxAmount;
				}
				else if (ammo->Amount < ammo->MaxAmount)
				{
					ammo->Amount = ammo->MaxAmount;
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "armor") == 0)
	{
		if (gameinfo.gametype != GAME_Hexen)
		{
			ABasicArmorPickup *armor = Spawn<ABasicArmorPickup> ();
			armor->SaveAmount = 100*deh.BlueAC;
			armor->SavePercent = gameinfo.Armor2Percent > 0? gameinfo.Armor2Percent : 0.5;
			if (!armor->CallTryPickup (player->mo))
			{
				armor->Destroy ();
			}
		}
		else
		{
			for (i = 0; i < 4; ++i)
			{
				AHexenArmor *armor = Spawn<AHexenArmor> ();
				armor->health = i;
				armor->Amount = 0;
				if (!armor->CallTryPickup (player->mo))
				{
					armor->Destroy ();
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "keys") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			if (PClassActor::AllActorClasses[i]->IsDescendantOf (RUNTIME_CLASS(AKey)))
			{
				AKey *key = (AKey *)GetDefaultByType (PClassActor::AllActorClasses[i]);
				if (key->KeyNumber != 0)
				{
					key = static_cast<AKey *>(Spawn(static_cast<PClassActor *>(PClassActor::AllActorClasses[i])));
					if (!key->CallTryPickup (player->mo))
					{
						key->Destroy ();
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "weapons") == 0)
	{
		AWeapon *savedpending = player->PendingWeapon;
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			// Don't give replaced weapons unless the replacement was done by Dehacked.
			if (type != RUNTIME_CLASS(AWeapon) &&
				type->IsDescendantOf (RUNTIME_CLASS(AWeapon)) &&
				(static_cast<PClassActor *>(type)->GetReplacement() == type ||
				 static_cast<PClassActor *>(type)->GetReplacement()->IsDescendantOf(RUNTIME_CLASS(ADehackedPickup))))
			{
				// Give the weapon only if it belongs to the current game or
				if (player->weapons.LocateWeapon(static_cast<PClassWeapon*>(type), NULL, NULL))
				{
					AWeapon *def = (AWeapon*)GetDefaultByType (type);
					if (giveall == ALL_YESYES || !(def->WeaponFlags & WIF_CHEATNOTWEAPON))
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
					}
				}
			}
		}
		player->PendingWeapon = savedpending;

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "artifacts") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid() && def->MaxAmount > 1 &&
					!type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(APowerup)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(AArmor)))
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "puzzlepieces") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid())
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall)
		return;

	type = PClass::FindActor(name);
	if (type == NULL || !type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		if (player == &players[consoleplayer])
			Printf ("Unknown item \"%s\"\n", name);
	}
	else
	{
		player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount, true);
	}
	return;
}